

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O0

learner<print,_example> *
LEARNER::init_learner<print,example,LEARNER::learner<char,char>>
          (free_ptr<print> *dat,_func_void_print_ptr_learner<char,_char>_ptr_example_ptr *learn,
          _func_void_print_ptr_learner<char,_char>_ptr_example_ptr *predict,size_t params_per_weight
          )

{
  learner<print,_example> *plVar1;
  unique_ptr<print,_void_(*)(void_*)> *in_RCX;
  _func_void_print_ptr_learner<char,_char>_ptr_example_ptr *in_RDX;
  _func_void_print_ptr_learner<char,_char>_ptr_example_ptr *in_RSI;
  learner<char,_char> *in_RDI;
  learner<print,_example> *ret;
  undefined8 in_stack_ffffffffffffffd8;
  prediction_type_t pred_type;
  
  pred_type = (prediction_type_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  std::unique_ptr<print,_void_(*)(void_*)>::get(in_RCX);
  plVar1 = learner<print,example>::init_learner<LEARNER::learner<char,char>>
                     ((print *)ret,in_RDI,in_RSI,in_RDX,(size_t)in_RCX,pred_type);
  std::unique_ptr<print,_void_(*)(void_*)>::release((unique_ptr<print,_void_(*)(void_*)> *)0x25a20e)
  ;
  return plVar1;
}

Assistant:

learner<T, E>& init_learner(
    free_ptr<T>& dat, void (*learn)(T&, L&, E&), void (*predict)(T&, L&, E&), size_t params_per_weight)
{
  auto ret =
      &learner<T, E>::init_learner(dat.get(), (L*)nullptr, learn, predict, params_per_weight, prediction_type::scalar);

  dat.release();
  return *ret;
}